

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.h
# Opt level: O0

int __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapeCube>::ClassId
          (TPZCompElKernelHDiv3D<pzshape::TPZShapeCube> *this)

{
  uint uVar1;
  int iVar2;
  string *in_stack_ffffffffffffffc0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  TPZCompElHCurl<pzshape::TPZShapeCube> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar1 = Hash(in_stack_ffffffffffffffc0);
  iVar2 = TPZCompElHCurl<pzshape::TPZShapeCube>::ClassId(in_stack_fffffffffffffff0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return uVar1 ^ iVar2 << 1;
}

Assistant:

int TPZCompElKernelHDiv3D<TSHAPE>::ClassId() const{
    return Hash("TPZCompElKernelHDiv3D") ^ TPZCompElHCurl<TSHAPE>::ClassId() << 1;
}